

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void setarrayvector(lua_State *L,Table *t,uint size)

{
  TValue *pTVar1;
  uint local_20;
  uint i;
  uint size_local;
  Table *t_local;
  lua_State *L_local;
  
  pTVar1 = (TValue *)luaM_realloc_(L,t->array,(ulong)t->sizearray << 4,(ulong)size << 4);
  t->array = pTVar1;
  for (local_20 = t->sizearray; local_20 < size; local_20 = local_20 + 1) {
    t->array[local_20].tt_ = 0;
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, unsigned int size) {
  unsigned int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}